

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::AssocArrayTraversalMethod::checkArguments
          (AssocArrayTraversalMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  Diagnostic *this_00;
  Type **ppTVar4;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount(&this->super_SystemSubroutine,context,true,args,range,1,1)
  ;
  if (bVar2) {
    pTVar3 = Type::getAssociativeIndexType(((*args->_M_ptr)->type).ptr);
    if (pTVar3 == (Type *)0x0) {
      this_00 = ASTContext::addDiag(context,(DiagCode)0x3000b,range);
      Diagnostic::operator<<(this_00,&(this->super_SystemSubroutine).name);
      ppTVar4 = &((context->scope).ptr)->compilation->errorType;
    }
    else {
      ppTVar4 = &pCVar1->intType;
    }
  }
  else {
    ppTVar4 = &pCVar1->errorType;
  }
  return *ppTVar4;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 1, 1))
            return comp.getErrorType();

        auto& type = *args[0]->type;
        auto indexType = type.getAssociativeIndexType();
        if (!indexType) {
            context.addDiag(diag::AssociativeWildcardNotAllowed, range) << name;
            return context.getCompilation().getErrorType();
        }

        return comp.getIntType();
    }